

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robber.cpp
# Opt level: O3

bool __thiscall Robber::canStayWith(Robber *this,Container *c)

{
  _List_node_base *p_Var1;
  byte bVar2;
  undefined1 extraout_AL;
  int iVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  size_t sVar6;
  Container *__s1;
  
  cVar4 = Container::begin(c);
  __s1 = c;
  cVar5 = Container::end(c);
  if (cVar4._M_node == cVar5._M_node) {
    bVar2 = 0;
  }
  else {
    bVar2 = 0;
    do {
      if (cVar4._M_node[1]._M_next == (_List_node_base *)0x0) {
        __cxa_bad_typeid();
        __s1->_vptr_Container = (_func_int **)&PTR_canDrive_00107b70;
        p_Var1 = (_List_node_base *)(__s1->name)._M_dataplus._M_p;
        if (p_Var1 != (_List_node_base *)&(__s1->name).field_2) {
          operator_delete(p_Var1);
        }
        operator_delete(__s1);
        return (bool)extraout_AL;
      }
      __s1 = (Container *)((cVar4._M_node[1]._M_next)->_M_next[-1]._M_prev)->_M_prev;
      if ((__s1 == (Container *)"9Policeman") ||
         ((*(char *)&__s1->_vptr_Container != '*' &&
          (iVar3 = strcmp((char *)__s1,"9Policeman"), iVar3 == 0)))) {
        bVar2 = 1;
      }
      cVar4._M_node = (cVar4._M_node)->_M_next;
    } while (cVar4._M_node != cVar5._M_node);
  }
  sVar6 = Container::size(c);
  if (!(bool)(sVar6 < 2 | bVar2)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Voleur seul avec la famille sans le policier",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  return (bool)(sVar6 < 2 | bVar2);
}

Assistant:

bool Robber::canStayWith(const Container &c) const {
    bool isPolicemanHere = false;

    // Iterates through the list of Person
    for (Person* p : c){
        if(typeid(*p) == typeid(Policeman)) isPolicemanHere = true;
    }

    // If there is no policeman, cannot be with other members
    if(c.size() > 1 && !isPolicemanHere) {
        std::cout << "Voleur seul avec la famille sans le policier" << std::endl;
        return false;
    }
    return true;
}